

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.cc
# Opt level: O2

bool __thiscall xsettingsd::ColorSetting::EqualsImpl(ColorSetting *this,Setting *other)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = false;
  lVar1 = __dynamic_cast(other,&Setting::typeinfo,&typeinfo,0);
  if (lVar1 != 0) {
    if (((*(uint16_t *)(lVar1 + 0x10) == this->red_) &&
        (*(uint16_t *)(lVar1 + 0x12) == this->green_)) &&
       (*(uint16_t *)(lVar1 + 0x14) == this->blue_)) {
      bVar2 = *(uint16_t *)(lVar1 + 0x16) == this->alpha_;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ColorSetting::EqualsImpl(const Setting& other) const {
  const ColorSetting* cast_other = dynamic_cast<const ColorSetting*>(&other);
  if (!cast_other)
    return false;
  return (cast_other->red_ == red_ &&
          cast_other->green_ == green_ &&
          cast_other->blue_ == blue_ &&
          cast_other->alpha_ == alpha_);
}